

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

isminetype __thiscall wallet::LegacyDataSPKM::IsMine(LegacyDataSPKM *this,CScript *script)

{
  long lVar1;
  IsMineResult IVar2;
  long in_FS_OFFSET;
  bool in_stack_0000017b;
  IsMineSigVersion in_stack_0000017c;
  CScript *in_stack_00000180;
  LegacyDataSPKM *in_stack_00000188;
  isminetype local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  IVar2 = anon_unknown_1::IsMineInner
                    (in_stack_00000188,in_stack_00000180,in_stack_0000017c,in_stack_0000017b);
  switch(IVar2) {
  case NO:
  case INVALID:
    local_c = ISMINE_NO;
    break;
  case WATCH_ONLY:
    local_c = ISMINE_WATCH_ONLY;
    break;
  case SPENDABLE:
    local_c = ISMINE_SPENDABLE;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0xe8,"virtual isminetype wallet::LegacyDataSPKM::IsMine(const CScript &) const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

isminetype LegacyDataSPKM::IsMine(const CScript& script) const
{
    switch (IsMineInner(*this, script, IsMineSigVersion::TOP)) {
    case IsMineResult::INVALID:
    case IsMineResult::NO:
        return ISMINE_NO;
    case IsMineResult::WATCH_ONLY:
        return ISMINE_WATCH_ONLY;
    case IsMineResult::SPENDABLE:
        return ISMINE_SPENDABLE;
    }
    assert(false);
}